

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O2

void testDefaultHelp_PrintToStream_ShouldSucceed(void)

{
  __type _Var1;
  reference __rhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Argengine ae;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string answer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream ss;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"test",(allocator<char> *)&answer);
  __l._M_len = 1;
  __l._M_array = (iterator)&ss;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8,__l,(allocator_type *)&local_220);
  juzzlin::Argengine::Argengine(&ae,&local_1e8,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::Argengine::setOutputStream((ostream *)&ae);
  juzzlin::Argengine::printHelp();
  juzzlin::Argengine::arguments_abi_cxx11_();
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(&local_200,0);
  std::operator+(&local_1b0,"Usage: ",__rhs);
  std::operator+(&local_220,&local_1b0," [OPTIONS]\n\nOptions:\n\n");
  std::operator+(&answer,&local_220,"-h, --help  Show this help.\n\n");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_220,&answer);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&answer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    juzzlin::Argengine::~Argengine(&ae);
    return;
  }
  __assert_fail("ss.str() == answer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                ,0x4b,"void testDefaultHelp_PrintToStream_ShouldSucceed()");
}

Assistant:

void testDefaultHelp_PrintToStream_ShouldSucceed()
{
    Argengine ae({ "test" });
    std::stringstream ss;
    ae.setOutputStream(ss);
    ae.printHelp();
    const std::string answer = "Usage: " + ae.arguments().at(0) + " [OPTIONS]\n\nOptions:\n\n" + //
      "-h, --help  Show this help.\n\n";
    assert(ss.str() == answer);
}